

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lclin.cpp
# Opt level: O2

Factor * __thiscall
libDAI::LCLin::Hdelpe
          (Factor *__return_storage_ptr__,LCLin *this,size_t i,Factor *fac,size_t Y,VarSet *ns)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TFactor<double> *this_00;
  Factor *Q;
  long lVar2;
  size_t K;
  ulong uVar3;
  size_t *psVar4;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> facs;
  vector<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_> pfacs;
  _Vector_base<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_>
  local_a0;
  VarSet local_88;
  TFactor<double> local_68;
  
  facs.super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  facs.super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  facs.super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((fac->_vs)._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (fac->_vs)._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
      super__Vector_impl_data._M_start) {
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::push_back
              (&facs,fac);
  }
  pfacs.
  super__Vector_base<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pfacs.
  super__Vector_base<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  pfacs.
  super__Vector_base<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
  psVar4 = *(size_t **)(*(long *)(CONCAT44(extraout_var,iVar1) + 0x70) + i * 0x18);
  while( true ) {
    iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    if (psVar4 == *(size_t **)(*(long *)(CONCAT44(extraout_var_00,iVar1) + 0x70) + 8 + i * 0x18))
    break;
    if (*psVar4 != Y) {
      iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      this_00 = (TFactor<double> *)
                (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar1) + 0x50))
                          ((long *)CONCAT44(extraout_var_01,iVar1),*psVar4);
      Q = phi(this,i,*psVar4);
      TFactor<double>::operator*(&local_68,this_00,Q);
      std::vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>>::
      emplace_back<libDAI::TFactor<double>>
                ((vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>> *)&facs,
                 &local_68);
      TFactor<double>::~TFactor(&local_68);
    }
    psVar4 = psVar4 + 1;
  }
  lVar2 = 0;
  for (uVar3 = 0;
      uVar3 < (ulong)(((long)facs.
                             super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)facs.
                            super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x38); uVar3 = uVar3 + 1) {
    local_68._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((long)&((facs.
                            super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_vs)._vars.
                          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar2);
    std::vector<libDAI::TFactor<double>const*,std::allocator<libDAI::TFactor<double>const*>>::
    emplace_back<libDAI::TFactor<double>const*>
              ((vector<libDAI::TFactor<double>const*,std::allocator<libDAI::TFactor<double>const*>>
                *)&pfacs,(TFactor<double> **)&local_68);
    lVar2 = lVar2 + 0x38;
  }
  VarSet::VarSet(&local_88,ns);
  std::vector<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_>::
  vector((vector<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_>
          *)&local_a0,&pfacs);
  notSumProd(__return_storage_ptr__,this,&local_88,
             (vector<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_>
              *)&local_a0);
  std::
  _Vector_base<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_>::
  ~_Vector_base(&local_a0);
  std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
            ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&local_88);
  std::
  _Vector_base<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_>::
  ~_Vector_base(&pfacs.
                 super__Vector_base<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_>
               );
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::~vector(&facs);
  return __return_storage_ptr__;
}

Assistant:

Factor LCLin::Hdelpe( size_t i, const Factor &fac, size_t Y, VarSet ns ) {
        std::vector<Factor> facs;
        if( fac.vars().size() )
            facs.push_back( fac );
        std::vector<const Factor *> pfacs;
        for( FactorGraph::nb_cit I = grm().nbV(i).begin(); I != grm().nbV(i).end(); I++ )
            if( *I != Y )
                facs.push_back( grm().factor(*I) * phi(i,*I) );
        for( size_t K = 0; K < facs.size(); K++ )
            pfacs.push_back( &(facs[K]) );
        return notSumProd( ns, pfacs );
    }